

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

int xmlHashAddEntry(xmlHashTablePtr hash,xmlChar *key,void *payload)

{
  uint uVar1;
  bool bVar2;
  
  uVar1 = xmlHashUpdateInternal
                    (hash,key,(xmlChar *)0x0,(xmlChar *)0x0,payload,(xmlHashDeallocator)0x0,0);
  bVar2 = uVar1 == 0;
  if (uVar1 == 1) {
    uVar1 = 0;
  }
  return uVar1 | -(uint)bVar2;
}

Assistant:

int
xmlHashAddEntry(xmlHashTablePtr hash, const xmlChar *key, void *payload) {
    int res = xmlHashUpdateInternal(hash, key, NULL, NULL, payload, NULL, 0);

    if (res == 0)
        res = -1;
    else if (res == 1)
        res = 0;

    return(res);
}